

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O1

uint32 __thiscall Js::RecyclableObjectWalker::GetChildrenCount(RecyclableObjectWalker *this)

{
  Type TVar1;
  Type ppDVar2;
  JavascriptRegExpConstructor *this_00;
  List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar3;
  HostDebugContext *pHVar4;
  code *pcVar5;
  ulong uVar6;
  bool bVar7;
  BOOL BVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  ArenaAllocator *pAVar13;
  List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar14;
  JavascriptRegExpConstructor *instance;
  undefined4 *puVar15;
  RecyclableObject *pRVar16;
  JavascriptString *propertyString;
  Var pvVar17;
  undefined4 extraout_var;
  ulong uVar18;
  PropertyId *pPVar19;
  JavascriptProxy *_instance;
  RecyclableProxyObjectWalker *this_01;
  RecyclableProtoObjectWalker *this_02;
  RecyclableArgumentsArrayWalker *this_03;
  JavascriptPromise *_instance_00;
  RecyclablePromiseObjectWalker *this_04;
  DynamicObject *pDVar20;
  JavascriptWeakSet *pJVar21;
  ScriptContext *pSVar22;
  DebugContext *pDVar23;
  RecyclableArrayWalker *this_05;
  undefined *puVar24;
  Var instance_00;
  ulong uVar25;
  Type typeId;
  ulong uVar26;
  uint uVar27;
  ArrayObject *obj;
  Type TVar28;
  undefined1 auStack_d8 [8];
  JavascriptStaticEnumerator enumerator;
  uint local_6c;
  PropertyRecord *pPStack_68;
  uint32 indexVal;
  Var varValue;
  undefined4 local_54;
  JavascriptRegExpConstructor *local_50;
  Type local_44;
  RecyclableMethodsGroupWalker *local_40;
  RecyclableMethodsGroupWalker *pMethodsGroupWalker;
  PropertyId propertyId;
  
  if (this->pMembersList !=
      (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
       *)0x0) goto LAB_008c4a04;
  pAVar13 = GetArenaFromContext(this->scriptContext);
  pLVar14 = (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             *)new<Memory::ArenaAllocator>(0x30,pAVar13,0x366bee);
  (pLVar14->
  super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>).
  buffer = (Type)0x0;
  (pLVar14->
  super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>).
  count = 0;
  (pLVar14->
  super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>).
  alloc = pAVar13;
  (pLVar14->
  super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>).
  _vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_014f9c80;
  pLVar14->length = 0;
  pLVar14->increment = 4;
  this->pMembersList = pLVar14;
  local_40 = (RecyclableMethodsGroupWalker *)0x0;
  bVar7 = VarIs<Js::RecyclableObject>(this->instance);
  if (bVar7) {
    instance = (JavascriptRegExpConstructor *)VarTo<Js::RecyclableObject>(this->instance);
    local_50 = instance;
    if (this->originalInstance != (Var)0x0) {
      local_50 = (JavascriptRegExpConstructor *)VarTo<Js::RecyclableObject>(this->originalInstance);
    }
    pvVar17 = this->instance;
    if (pvVar17 == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar15 = 1;
      bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar7) goto LAB_008c4adc;
      *puVar15 = 0;
    }
    varValue = pAVar13;
    if (((ulong)pvVar17 & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)pvVar17 & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar15 = 1;
      bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar7) goto LAB_008c4adc;
      *puVar15 = 0;
    }
    pAVar13 = (ArenaAllocator *)varValue;
    typeId = TypeIds_FirstNumberType;
    if ((((ulong)pvVar17 & 0xffff000000000000) != 0x1000000000000) &&
       (typeId = TypeIds_Number, (ulong)pvVar17 >> 0x32 == 0)) {
      pRVar16 = UnsafeVarTo<Js::RecyclableObject>(pvVar17);
      if (pRVar16 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar15 = 1;
        bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar7) goto LAB_008c4adc;
        *puVar15 = 0;
      }
      typeId = ((pRVar16->type).ptr)->typeId;
      if ((0x57 < (int)typeId) && (BVar8 = RecyclableObject::IsExternal(pRVar16), BVar8 == 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar15 = 1;
        bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar7) goto LAB_008c4adc;
        *puVar15 = 0;
      }
    }
    BVar8 = JavascriptOperators::IsObject((RecyclableObject *)instance);
    if (BVar8 == 0) goto LAB_008c49d6;
    BVar8 = RecyclableObject::IsExternal((RecyclableObject *)instance);
    if (BVar8 == 0) {
      TVar1 = ((instance->super_RuntimeFunction).super_JavascriptFunction.super_DynamicObject.
               super_RecyclableObject.type.ptr)->typeId;
      if ((0x57 < (int)TVar1) &&
         (BVar8 = RecyclableObject::IsExternal((RecyclableObject *)instance), BVar8 == 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar15 = 1;
        bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar7) goto LAB_008c4adc;
        *puVar15 = 0;
      }
      if (TVar1 == TypeIds_Proxy) goto LAB_008c3f60;
      local_44 = ((instance->super_RuntimeFunction).super_JavascriptFunction.super_DynamicObject.
                  super_RecyclableObject.type.ptr)->typeId;
      if ((0x57 < (int)local_44) &&
         (BVar8 = RecyclableObject::IsExternal((RecyclableObject *)instance), BVar8 == 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar15 = 1;
        bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar7) goto LAB_008c4adc;
        *puVar15 = 0;
      }
      if (local_44 == TypeIds_UnscopablesWrapperObject) {
        pvVar17 = JavascriptOperators::OP_UnwrapWithObj(instance);
        instance = (JavascriptRegExpConstructor *)UnsafeVarTo<Js::RecyclableObject>(pvVar17);
      }
      uVar10 = (*(instance->super_RuntimeFunction).super_JavascriptFunction.super_DynamicObject.
                 super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                 _vptr_IRecyclerVisitedObject[10])(instance);
      if (0 < (int)uVar10) {
        uVar26 = 0;
        do {
          iVar9 = (*(instance->super_RuntimeFunction).super_JavascriptFunction.super_DynamicObject.
                    super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[7])(instance,uVar26 & 0xffff);
          if (local_44 == TypeIds_UnscopablesWrapperObject) {
            BVar8 = JavascriptOperators::IsPropertyUnscopable(instance,iVar9);
            bVar7 = BVar8 != 0;
          }
          else {
            bVar7 = false;
          }
          if (iVar9 - 0x10U < 0xffffffef) {
            InsertItem(this,(RecyclableObject *)local_50,(RecyclableObject *)instance,iVar9,false,
                       bVar7,&local_40,false);
          }
          uVar27 = (int)uVar26 + 1;
          uVar26 = (ulong)uVar27;
        } while (uVar10 != uVar27);
      }
      if (DAT_015b5f8b != '\0') {
        uVar10 = (*(instance->super_RuntimeFunction).super_JavascriptFunction.super_DynamicObject.
                   super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                   _vptr_IRecyclerVisitedObject[0x40])(instance);
        iVar9 = (*(instance->super_RuntimeFunction).super_JavascriptFunction.super_DynamicObject.
                  super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x41])(instance);
        enumerator.arrayEnumerator.ptr = (JavascriptEnumerator *)CONCAT44(extraout_var,iVar9);
        if (0 < (int)uVar10) {
          puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          uVar26 = 0;
          do {
            iVar9 = *(int *)((long)&((enumerator.arrayEnumerator.ptr)->super_RecyclableObject).
                                    super_FinalizableObject.super_IRecyclerVisitedObject.
                                    _vptr_IRecyclerVisitedObject + uVar26 * 4);
            if (local_44 == TypeIds_UnscopablesWrapperObject) {
              BVar8 = JavascriptOperators::IsPropertyUnscopable(instance,iVar9);
              local_54 = CONCAT31((int3)((uint)BVar8 >> 8),BVar8 != 0);
            }
            else {
              local_54 = 0;
            }
            if (iVar9 != -1) {
              bVar7 = true;
              if (iVar9 == 0xd1) {
                bVar7 = JavascriptArray::IsNonES5Array(instance);
                bVar7 = !bVar7;
              }
              pMethodsGroupWalker._7_1_ = bVar7;
              bVar7 = VarIs<Js::BoundFunction,Js::RecyclableObject>((RecyclableObject *)instance);
              if (bVar7) {
                uVar18 = (ulong)(this->pMembersList->
                                super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>
                                ).count;
                bVar7 = 0 < (long)uVar18;
                if (0 < (long)uVar18) {
                  ppDVar2 = (this->pMembersList->
                            super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>
                            ).buffer;
                  if ((*ppDVar2)->propId == iVar9) goto LAB_008c438f;
                  uVar6 = 1;
                  do {
                    uVar25 = uVar6;
                    if (uVar18 == uVar25) break;
                    uVar6 = uVar25 + 1;
                  } while (ppDVar2[uVar25]->propId != iVar9);
                  bVar7 = uVar25 < uVar18;
                }
                if (bVar7) goto LAB_008c438f;
              }
              uVar18 = (ulong)(this->pMembersList->
                              super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>
                              ).count;
              bVar7 = 0 < (long)uVar18;
              if ((long)uVar18 < 1) {
LAB_008c430b:
                if (bVar7) goto LAB_008c430f;
              }
              else {
                ppDVar2 = (this->pMembersList->
                          super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>
                          ).buffer;
                if ((*ppDVar2)->propId != iVar9) {
                  uVar6 = 1;
                  do {
                    uVar25 = uVar6;
                    if (uVar18 == uVar25) break;
                    uVar6 = uVar25 + 1;
                  } while (ppDVar2[uVar25]->propId != iVar9);
                  bVar7 = uVar25 < uVar18;
                  goto LAB_008c430b;
                }
LAB_008c430f:
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                *puVar15 = 1;
                bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                            ,0x9ec,"(!this->pMembersList->Any(containsPredicate))",
                                            "Special property already on the object, no need to insert."
                                           );
                if (!bVar7) goto LAB_008c4adc;
                *puVar15 = 0;
              }
              InsertItem(this,(RecyclableObject *)local_50,(RecyclableObject *)instance,iVar9,
                         (bool)pMethodsGroupWalker._7_1_,local_54._0_1_,&local_40,false);
            }
LAB_008c438f:
            uVar26 = uVar26 + 1;
          } while (uVar26 != uVar10);
        }
        bVar7 = VarIsImpl<Js::JavascriptFunction>((RecyclableObject *)instance);
        if ((bVar7) &&
           (this_00 = (((this->scriptContext->super_ScriptContextBase).javascriptLibrary)->
                      super_JavascriptLibraryBase).regexConstructor.ptr, this_00 == instance)) {
          uVar11 = JavascriptRegExpConstructor::GetSpecialEnumerablePropertyCount(this_00);
          pPVar19 = JavascriptRegExpConstructor::GetSpecialEnumerablePropertyIds(this_00);
          if (0 < (int)uVar11) {
            uVar26 = 0;
            do {
              InsertItem(this,(RecyclableObject *)local_50,(RecyclableObject *)instance,
                         pPVar19[uVar26],true,false,&local_40,false);
              uVar26 = uVar26 + 1;
            } while (uVar11 != uVar26);
          }
        }
      }
      pRVar16 = RecyclableObject::GetPrototype((RecyclableObject *)instance);
      pAVar13 = (ArenaAllocator *)varValue;
      if (pRVar16 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar15 = 1;
        bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar7) goto LAB_008c4adc;
        *puVar15 = 0;
      }
      TVar1 = ((pRVar16->type).ptr)->typeId;
      if ((0x57 < (int)TVar1) && (BVar8 = RecyclableObject::IsExternal(pRVar16), BVar8 == 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar15 = 1;
        bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar7) goto LAB_008c4adc;
        *puVar15 = 0;
      }
      if (TVar1 != TypeIds_Null) {
        EnsureFakeGroupObjectWalkerList(this);
        this_02 = (RecyclableProtoObjectWalker *)new<Memory::ArenaAllocator>(0x38,pAVar13,0x366bee);
        pSVar22 = this->scriptContext;
        instance_00 = this->instance;
        pvVar17 = this->originalInstance;
        goto LAB_008c4726;
      }
    }
    else {
LAB_008c3f60:
      pSVar22 = (((((instance->super_RuntimeFunction).super_JavascriptFunction.super_DynamicObject.
                    super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
                super_JavascriptLibraryBase).scriptContext.ptr;
      auStack_d8 = (undefined1  [8])0x0;
      enumerator.propertyEnumerator.scriptContext.ptr = (ScriptContext *)0x0;
      enumerator.propertyEnumerator.object.ptr = (DynamicObject *)0x0;
      enumerator.propertyEnumerator.enumeratedCount = 0;
      enumerator.propertyEnumerator.flags = None;
      enumerator.propertyEnumerator._37_3_ = 0;
      enumerator.propertyEnumerator.cachedData.ptr = (CachedData *)0x0;
      enumerator.currentEnumerator.ptr = (JavascriptEnumerator *)0x0;
      enumerator.prefixEnumerator.ptr = (JavascriptEnumerator *)0x0;
      JavascriptStaticEnumerator::Clear
                ((JavascriptStaticEnumerator *)auStack_d8,None,(ScriptContext *)0x0);
      iVar9 = (*(instance->super_RuntimeFunction).super_JavascriptFunction.super_DynamicObject.
                super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x2b])(instance,auStack_d8,3,pSVar22);
      if (iVar9 != 0) {
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        while (propertyString =
                    JavascriptStaticEnumerator::MoveAndGetNext
                              ((JavascriptStaticEnumerator *)auStack_d8,
                               (PropertyId *)&pMethodsGroupWalker,(PropertyAttributes *)0x0),
              pAVar13 = (ArenaAllocator *)varValue, propertyString != (JavascriptString *)0x0) {
          if ((uint)pMethodsGroupWalker == 0xffffffff) {
            ScriptContext::GetOrAddPropertyRecord(pSVar22,propertyString,&stack0xffffffffffffff98);
            pMethodsGroupWalker._0_4_ = pPStack_68->pid;
          }
          if ((uint)pMethodsGroupWalker < 0x10) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar15 = 1;
            bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                        ,0x987,"(!Js::IsInternalPropertyId(propertyId))",
                                        "!Js::IsInternalPropertyId(propertyId)");
            if (!bVar7) goto LAB_008c4adc;
            *puVar15 = 0;
          }
          BVar8 = ScriptContext::IsNumericPropertyId(pSVar22,(uint)pMethodsGroupWalker,&local_6c);
          if ((BVar8 == 0) ||
             (iVar9 = (*(instance->super_RuntimeFunction).super_JavascriptFunction.
                        super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
                        super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x26])
                                (instance,instance,(ulong)local_6c), iVar9 != 1)) {
            InsertItem(this,(RecyclableObject *)local_50,(RecyclableObject *)instance,
                       (uint)pMethodsGroupWalker,false,false,&local_40,true);
          }
          else {
            InsertItem(this,(uint)pMethodsGroupWalker,false,false,pPStack_68,&local_40,true);
          }
        }
      }
      if (typeId == TypeIds_Proxy) {
        EnsureFakeGroupObjectWalkerList(this);
        _instance = VarTo<Js::JavascriptProxy,Js::RecyclableObject>((RecyclableObject *)instance);
        this_01 = (RecyclableProxyObjectWalker *)new<Memory::ArenaAllocator>(0x38,pAVar13,0x366bee);
        RecyclableProxyObjectWalker::RecyclableProxyObjectWalker
                  (this_01,this->scriptContext,_instance);
        pLVar3 = this->fakeGroupObjectWalkerList;
        JsUtil::
        List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        ::EnsureArray(pLVar3,0);
        iVar9 = (pLVar3->
                super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
                ).count;
        (pLVar3->
        super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
        ).buffer[iVar9] = (IDiagObjectModelWalkerBase *)this_01;
        (pLVar3->
        super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
        ).count = iVar9 + 1;
      }
      pRVar16 = RecyclableObject::GetPrototype((RecyclableObject *)instance);
      if (pRVar16 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar15 = 1;
        bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar7) goto LAB_008c4adc;
        *puVar15 = 0;
      }
      TVar1 = ((pRVar16->type).ptr)->typeId;
      if ((0x57 < (int)TVar1) && (BVar8 = RecyclableObject::IsExternal(pRVar16), BVar8 == 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar15 = 1;
        bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar7) goto LAB_008c4adc;
        *puVar15 = 0;
      }
      if (TVar1 != TypeIds_Null) {
        EnsureFakeGroupObjectWalkerList(this);
        this_02 = (RecyclableProtoObjectWalker *)new<Memory::ArenaAllocator>(0x38,pAVar13,0x366bee);
        pSVar22 = this->scriptContext;
        instance_00 = this->instance;
        pvVar17 = this->originalInstance;
        if (this->originalInstance == (Var)0x0) {
          pvVar17 = instance_00;
        }
LAB_008c4726:
        RecyclableProtoObjectWalker::RecyclableProtoObjectWalker
                  (this_02,pSVar22,instance_00,pvVar17);
        pLVar3 = this->fakeGroupObjectWalkerList;
        JsUtil::
        List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        ::EnsureArray(pLVar3,0);
        iVar9 = (pLVar3->
                super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
                ).count;
        (pLVar3->
        super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
        ).buffer[iVar9] = (IDiagObjectModelWalkerBase *)this_02;
        (pLVar3->
        super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
        ).count = iVar9 + 1;
      }
    }
    switch(typeId) {
    case TypeIds_Map:
      EnsureFakeGroupObjectWalkerList(this);
      pJVar21 = (JavascriptWeakSet *)
                VarTo<Js::JavascriptMap,Js::RecyclableObject>((RecyclableObject *)instance);
      this_04 = (RecyclablePromiseObjectWalker *)new<Memory::ArenaAllocator>(0x20,pAVar13,0x366bee);
      pSVar22 = this->scriptContext;
      puVar24 = &RecyclableCollectionObjectWalker<Js::JavascriptMap>::vtable;
      break;
    case TypeIds_Set:
      EnsureFakeGroupObjectWalkerList(this);
      pJVar21 = (JavascriptWeakSet *)
                VarTo<Js::JavascriptSet,Js::RecyclableObject>((RecyclableObject *)instance);
      this_04 = (RecyclablePromiseObjectWalker *)new<Memory::ArenaAllocator>(0x20,pAVar13,0x366bee);
      pSVar22 = this->scriptContext;
      puVar24 = &RecyclableCollectionObjectWalker<Js::JavascriptSet>::vtable;
      break;
    case TypeIds_WeakMap:
      EnsureFakeGroupObjectWalkerList(this);
      pJVar21 = (JavascriptWeakSet *)
                VarTo<Js::JavascriptWeakMap,Js::RecyclableObject>((RecyclableObject *)instance);
      this_04 = (RecyclablePromiseObjectWalker *)new<Memory::ArenaAllocator>(0x20,pAVar13,0x366bee);
      pSVar22 = this->scriptContext;
      puVar24 = &RecyclableCollectionObjectWalker<Js::JavascriptWeakMap>::vtable;
      break;
    case TypeIds_WeakSet:
      EnsureFakeGroupObjectWalkerList(this);
      pJVar21 = VarTo<Js::JavascriptWeakSet,Js::RecyclableObject>((RecyclableObject *)instance);
      this_04 = (RecyclablePromiseObjectWalker *)new<Memory::ArenaAllocator>(0x20,pAVar13,0x366bee);
      pSVar22 = this->scriptContext;
      puVar24 = &RecyclableCollectionObjectWalker<Js::JavascriptWeakSet>::vtable;
      break;
    default:
      if (typeId != TypeIds_Promise) {
        if (typeId == TypeIds_Arguments) {
          pDVar20 = (DynamicObject *)this->instance;
          if (pDVar20 == (DynamicObject *)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar15 = 1;
            bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                        ,0xa19,"(argObj)","argObj");
            if (!bVar7) {
LAB_008c4adc:
              pcVar5 = (code *)invalidInstructionException();
              (*pcVar5)();
            }
            *puVar15 = 0;
          }
          iVar9 = (*(pDVar20->super_RecyclableObject).super_FinalizableObject.
                    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x6b])(pDVar20);
          if ((iVar9 != 0) || (bVar7 = DynamicObject::HasNonEmptyObjectArray(pDVar20), bVar7)) {
            this_03 = (RecyclableArgumentsArrayWalker *)
                      new<Memory::ArenaAllocator>(0x58,pAVar13,0x366bee);
            RecyclableArgumentsArrayWalker::RecyclableArgumentsArrayWalker
                      (this_03,this->scriptContext,this->instance,this->originalInstance);
            this->innerArrayObjectWalker = (RecyclableArrayWalker *)this_03;
          }
        }
        else {
          bVar7 = DynamicType::Is(typeId);
          if (bVar7) {
            pDVar20 = VarTo<Js::DynamicObject>(this->instance);
            bVar7 = DynamicObject::HasNonEmptyObjectArray(pDVar20);
            if (bVar7) {
              bVar7 = DynamicObject::HasObjectArray(pDVar20);
              if (bVar7) {
                obj = *(ArrayObject **)&(pDVar20->field_1).field_1;
              }
              else {
                obj = (ArrayObject *)0x0;
              }
              bVar7 = VarIs<Js::ES5Array,Js::ArrayObject>(obj);
              if (bVar7) {
                this_05 = (RecyclableArrayWalker *)
                          new<Memory::ArenaAllocator>(0x50,pAVar13,0x366bee);
                RecyclableES5ArrayWalker::RecyclableES5ArrayWalker
                          ((RecyclableES5ArrayWalker *)this_05,this->scriptContext,obj,
                           this->originalInstance);
              }
              else {
                bVar7 = JavascriptArray::IsNonES5Array(obj);
                this_05 = (RecyclableArrayWalker *)
                          new<Memory::ArenaAllocator>(0x50,pAVar13,0x366bee);
                if (bVar7) {
                  RecyclableArrayWalker::RecyclableArrayWalker
                            (this_05,this->scriptContext,obj,this->originalInstance);
                }
                else {
                  RecyclableTypedArrayWalker::RecyclableTypedArrayWalker
                            ((RecyclableTypedArrayWalker *)this_05,this->scriptContext,obj,
                             this->originalInstance);
                }
              }
              this->innerArrayObjectWalker = this_05;
              this_05->fOnlyOwnProperties = true;
            }
          }
        }
        goto LAB_008c49d6;
      }
      EnsureFakeGroupObjectWalkerList(this);
      _instance_00 = VarTo<Js::JavascriptPromise,Js::RecyclableObject>((RecyclableObject *)instance)
      ;
      this_04 = (RecyclablePromiseObjectWalker *)new<Memory::ArenaAllocator>(0x38,pAVar13,0x366bee);
      RecyclablePromiseObjectWalker::RecyclablePromiseObjectWalker
                (this_04,this->scriptContext,_instance_00);
      goto LAB_008c49b5;
    }
    (this_04->super_RecyclableObjectWalker).super_IDiagObjectModelWalkerBase.
    _vptr_IDiagObjectModelWalkerBase = (_func_int **)(puVar24 + 0x10);
    (this_04->super_RecyclableObjectWalker).scriptContext = pSVar22;
    (this_04->super_RecyclableObjectWalker).instance = pJVar21;
    (this_04->super_RecyclableObjectWalker).originalInstance = (Var)0x0;
LAB_008c49b5:
    pLVar3 = this->fakeGroupObjectWalkerList;
    JsUtil::
    List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ::EnsureArray(pLVar3,0);
    iVar9 = (pLVar3->
            super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
            ).count;
    (pLVar3->
    super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>).
    buffer[iVar9] = (IDiagObjectModelWalkerBase *)this_04;
    (pLVar3->
    super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>).
    count = iVar9 + 1;
  }
LAB_008c49d6:
  if (local_40 != (RecyclableMethodsGroupWalker *)0x0) {
    RecyclableMethodsGroupWalker::Sort(local_40);
  }
  pDVar23 = ScriptContext::GetDebugContext(this->scriptContext);
  pHVar4 = pDVar23->hostDebugContext;
  if (pHVar4 != (HostDebugContext *)0x0) {
    (*pHVar4->_vptr_HostDebugContext[5])(pHVar4,this->pMembersList,this->scriptContext);
  }
LAB_008c4a04:
  iVar9 = (this->pMembersList->
          super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>
          ).count;
  TVar28 = 0;
  iVar12 = 0;
  if (this->innerArrayObjectWalker != (RecyclableArrayWalker *)0x0) {
    iVar12 = (*(this->innerArrayObjectWalker->super_RecyclableObjectWalker).
               super_IDiagObjectModelWalkerBase._vptr_IDiagObjectModelWalkerBase[1])();
  }
  if (this->fakeGroupObjectWalkerList !=
      (List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
       *)0x0) {
    TVar28 = (this->fakeGroupObjectWalkerList->
             super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
             ).count;
  }
  return iVar12 + iVar9 + TVar28;
}

Assistant:

uint32 RecyclableObjectWalker::GetChildrenCount()
    {
        if (pMembersList == nullptr)
        {
            ArenaAllocator *arena = GetArenaFromContext(scriptContext);

            pMembersList = JsUtil::List<DebuggerPropertyDisplayInfo *, ArenaAllocator>::New(arena);

            RecyclableMethodsGroupWalker *pMethodsGroupWalker = nullptr;

            if (Js::VarIs<Js::RecyclableObject>(instance))
            {
                Js::RecyclableObject* object = Js::VarTo<Js::RecyclableObject>(instance);
                // If we are walking a prototype, we'll use its instance for property names enumeration, but originalInstance to get values
                Js::RecyclableObject* originalObject = (originalInstance != nullptr) ? Js::VarTo<Js::RecyclableObject>(originalInstance) : object;
                const Js::TypeId typeId = JavascriptOperators::GetTypeId(instance);

                if (JavascriptOperators::IsObject(object))
                {
                    if (object->IsExternal() || JavascriptOperators::GetTypeId(object) == TypeIds_Proxy)
                    {
                        try
                        {
                            ScriptContext * objectContext = object->GetScriptContext();
                            JavascriptStaticEnumerator enumerator;
                            if (object->GetEnumerator(&enumerator, EnumeratorFlags::EnumNonEnumerable | EnumeratorFlags::EnumSymbols, objectContext))
                            {
                                Js::PropertyId propertyId;
                                JavascriptString * obj;

                                while ((obj = enumerator.MoveAndGetNext(propertyId)) != nullptr)
                                {
                                    if (propertyId == Constants::NoProperty)
                                    {
                                        const PropertyRecord* propertyRecord;
                                        objectContext->GetOrAddPropertyRecord(obj, &propertyRecord);
                                        propertyId = propertyRecord->GetPropertyId();
                                    }
                                    // MoveAndGetNext shouldn't return an internal property id
                                    Assert(!Js::IsInternalPropertyId(propertyId));

                                    uint32 indexVal;
                                    Var varValue;
                                    if (objectContext->IsNumericPropertyId(propertyId, &indexVal) && object->GetItem(object, indexVal, &varValue, objectContext))
                                    {
                                        InsertItem(propertyId, false /*isConst*/, false /*isUnscoped*/, varValue, &pMethodsGroupWalker, true /*shouldPinProperty*/);
                                    }
                                    else
                                    {
                                        InsertItem(originalObject, object, propertyId, false /*isConst*/, false /*isUnscoped*/, &pMethodsGroupWalker, true /*shouldPinProperty*/);
                                    }
                                }
                            }
                        }
                        catch (const JavascriptException& err)
                        {
                            Var error = err.GetAndClear()->GetThrownObject(scriptContext);
                            if (error != nullptr && Js::VarIs<Js::JavascriptError>(error))
                            {
                                Js::PropertyId propertyId = scriptContext->GetOrAddPropertyIdTracked(_u("{error}"));
                                InsertItem(propertyId, false /*isConst*/, false /*isUnscoped*/, error, &pMethodsGroupWalker);
                            }
                        }

                        if (typeId == TypeIds_Proxy)
                        {
                            // Provide [Proxy] group object
                            EnsureFakeGroupObjectWalkerList();

                            JavascriptProxy* proxy = VarTo<JavascriptProxy>(object);
                            RecyclableProxyObjectWalker* proxyWalker = Anew(arena, RecyclableProxyObjectWalker, scriptContext, proxy);
                            fakeGroupObjectWalkerList->Add(proxyWalker);
                        }
                        // If current object has internal proto object then provide [prototype] group object.
                        if (JavascriptOperators::GetTypeId(object->GetPrototype()) != TypeIds_Null)
                        {
                            // Has [prototype] object.
                            EnsureFakeGroupObjectWalkerList();

                            RecyclableProtoObjectWalker *pProtoWalker = Anew(arena, RecyclableProtoObjectWalker, scriptContext, instance, (originalInstance == nullptr) ? instance : originalInstance);
                            fakeGroupObjectWalkerList->Add(pProtoWalker);
                        }
                    }
                    else
                    {
                        RecyclableObject* wrapperObject = nullptr;
                        if (JavascriptOperators::GetTypeId(object) == TypeIds_UnscopablesWrapperObject)
                        {
                            wrapperObject = object;
                            object = Js::UnsafeVarTo<Js::RecyclableObject>(JavascriptOperators::OP_UnwrapWithObj(wrapperObject));
                        }

                        int count = object->GetPropertyCount();

                        for (int i = 0; i < count; i++)
                        {
                            Js::PropertyId propertyId = object->GetPropertyId((PropertyIndex)i);
                            bool isUnscoped = false;
                            if (wrapperObject && JavascriptOperators::IsPropertyUnscopable(object, propertyId))
                            {
                                isUnscoped = true;
                            }
                            if (propertyId != Js::Constants::NoProperty && !Js::IsInternalPropertyId(propertyId))
                            {
                                InsertItem(originalObject, object, propertyId, false /*isConst*/, isUnscoped, &pMethodsGroupWalker);
                            }
                        }

                        if (CONFIG_FLAG(EnumerateSpecialPropertiesInDebugger))
                        {
                            count = object->GetSpecialPropertyCount();
                            PropertyId const * specialPropertyIds = object->GetSpecialPropertyIds();
                            for (int i = 0; i < count; i++)
                            {
                                Js::PropertyId propertyId = specialPropertyIds[i];
                                bool isUnscoped = false;
                                if (wrapperObject && JavascriptOperators::IsPropertyUnscopable(object, propertyId))
                                {
                                    isUnscoped = true;
                                }
                                if (propertyId != Js::Constants::NoProperty)
                                {
                                    bool isConst = true;
                                    if (propertyId == PropertyIds::length && Js::JavascriptArray::IsNonES5Array(object))
                                    {
                                        // For JavascriptArrays, we allow resetting the length special property.
                                        isConst = false;
                                    }

                                    auto containsPredicate = [&](Js::DebuggerPropertyDisplayInfo* info) { return info->propId == propertyId; };
                                    if (Js::VarIs<Js::BoundFunction>(object)
                                        && this->pMembersList->Any(containsPredicate))
                                    {
                                        // Bound functions can already contain their special properties,
                                        // so we need to check for that (caller and arguments).  This occurs
                                        // when JavascriptFunction::EntryBind() is called.  Arguments can similarly
                                        // already display caller in compat mode 8.
                                        continue;
                                    }

                                    AssertMsg(!this->pMembersList->Any(containsPredicate), "Special property already on the object, no need to insert.");

                                    InsertItem(originalObject, object, propertyId, isConst, isUnscoped, &pMethodsGroupWalker);
                                }
                            }
                            if (Js::VarIs<Js::JavascriptFunction>(object))
                            {
                                // We need to special-case RegExp constructor here because it has some special properties (above) and some
                                // special enumerable properties which should all show up in the debugger.
                                JavascriptRegExpConstructor* regExp = scriptContext->GetLibrary()->GetRegExpConstructor();

                                if (regExp == object)
                                {
                                    bool isUnscoped = false;
                                    bool isConst = true;
                                    count = regExp->GetSpecialEnumerablePropertyCount();
                                    PropertyId const * specialEnumerablePropertyIds = regExp->GetSpecialEnumerablePropertyIds();

                                    for (int i = 0; i < count; i++)
                                    {
                                        Js::PropertyId propertyId = specialEnumerablePropertyIds[i];

                                        InsertItem(originalObject, object, propertyId, isConst, isUnscoped, &pMethodsGroupWalker);
                                    }
                                }
                            }
                        }

                        // If current object has internal proto object then provide [prototype] group object.
                        if (JavascriptOperators::GetTypeId(object->GetPrototype()) != TypeIds_Null)
                        {
                            // Has [prototype] object.
                            EnsureFakeGroupObjectWalkerList();

                            RecyclableProtoObjectWalker *pProtoWalker = Anew(arena, RecyclableProtoObjectWalker, scriptContext, instance, originalInstance);
                            fakeGroupObjectWalkerList->Add(pProtoWalker);
                        }
                    }

                    // If the object contains array indices.
                    if (typeId == TypeIds_Arguments)
                    {
                        // Create ArgumentsArray walker for an arguments object

                        Js::ArgumentsObject * argObj = static_cast<Js::ArgumentsObject*>(instance);
                        Assert(argObj);

                        if (argObj->GetNumberOfArguments() > 0 || argObj->HasNonEmptyObjectArray())
                        {
                            innerArrayObjectWalker = Anew(arena, RecyclableArgumentsArrayWalker, scriptContext, (Var)instance, originalInstance);
                        }
                    }
                    else if (typeId == TypeIds_Map)
                    {
                        // Provide [Map] group object.
                        EnsureFakeGroupObjectWalkerList();

                        JavascriptMap* map = VarTo<JavascriptMap>(object);
                        RecyclableMapObjectWalker *pMapWalker = Anew(arena, RecyclableMapObjectWalker, scriptContext, map);
                        fakeGroupObjectWalkerList->Add(pMapWalker);
                    }
                    else if (typeId == TypeIds_Set)
                    {
                        // Provide [Set] group object.
                        EnsureFakeGroupObjectWalkerList();

                        JavascriptSet* set = VarTo<JavascriptSet>(object);
                        RecyclableSetObjectWalker *pSetWalker = Anew(arena, RecyclableSetObjectWalker, scriptContext, set);
                        fakeGroupObjectWalkerList->Add(pSetWalker);
                    }
                    else if (typeId == TypeIds_WeakMap)
                    {
                        // Provide [WeakMap] group object.
                        EnsureFakeGroupObjectWalkerList();

                        JavascriptWeakMap* weakMap = VarTo<JavascriptWeakMap>(object);
                        RecyclableWeakMapObjectWalker *pWeakMapWalker = Anew(arena, RecyclableWeakMapObjectWalker, scriptContext, weakMap);
                        fakeGroupObjectWalkerList->Add(pWeakMapWalker);
                    }
                    else if (typeId == TypeIds_WeakSet)
                    {
                        // Provide [WeakSet] group object.
                        EnsureFakeGroupObjectWalkerList();

                        JavascriptWeakSet* weakSet = VarTo<JavascriptWeakSet>(object);
                        RecyclableWeakSetObjectWalker *pWeakSetWalker = Anew(arena, RecyclableWeakSetObjectWalker, scriptContext, weakSet);
                        fakeGroupObjectWalkerList->Add(pWeakSetWalker);
                    }
                    else if (typeId == TypeIds_Promise)
                    {
                        // Provide [Promise] group object.
                        EnsureFakeGroupObjectWalkerList();

                        JavascriptPromise* promise = VarTo<JavascriptPromise>(object);
                        RecyclablePromiseObjectWalker *pPromiseWalker = Anew(arena, RecyclablePromiseObjectWalker, scriptContext, promise);
                        fakeGroupObjectWalkerList->Add(pPromiseWalker);
                    }
                    else if (Js::DynamicType::Is(typeId))
                    {
                        DynamicObject *const dynamicObject = Js::VarTo<Js::DynamicObject>(instance);
                        if (dynamicObject->HasNonEmptyObjectArray())
                        {
                            ArrayObject* objectArray = dynamicObject->GetObjectArray();
                            if (Js::VarIs<Js::ES5Array>(objectArray))
                            {
                                innerArrayObjectWalker = Anew(arena, RecyclableES5ArrayWalker, scriptContext, objectArray, originalInstance);
                            }
                            else if (Js::JavascriptArray::IsNonES5Array(objectArray))
                            {
                                innerArrayObjectWalker = Anew(arena, RecyclableArrayWalker, scriptContext, objectArray, originalInstance);
                            }
                            else
                            {
                                innerArrayObjectWalker = Anew(arena, RecyclableTypedArrayWalker, scriptContext, objectArray, originalInstance);
                            }

                            innerArrayObjectWalker->SetOnlyWalkOwnProperties(true);
                        }
                    }
                }
            }
            // Sort the members of the methods group
            if (pMethodsGroupWalker)
            {
                pMethodsGroupWalker->Sort();
            }

            // Sort current pMembersList.
            HostDebugContext* hostDebugContext = scriptContext->GetDebugContext()->GetHostDebugContext();
            if (hostDebugContext != nullptr)
            {
                hostDebugContext->SortMembersList(pMembersList, scriptContext);
            }
        }

        uint32 childrenCount =
            pMembersList->Count()
          + (innerArrayObjectWalker ? innerArrayObjectWalker->GetChildrenCount() : 0)
          + (fakeGroupObjectWalkerList ? fakeGroupObjectWalkerList->Count() : 0);

        return childrenCount;
    }